

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O3

uint Assimp::strtoul16(char *in,char **out)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = 0;
  do {
    cVar1 = *in;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar2 = uVar2 << 4 | (uint)(byte)(cVar1 - 0x30U);
    }
    else {
      bVar3 = cVar1 + 0xbf;
      if (5 < bVar3) {
        bVar3 = cVar1 + 0x9f;
        if (5 < bVar3) {
          if (out != (char **)0x0) {
            *out = in;
          }
          return uVar2;
        }
      }
      uVar2 = uVar2 * 0x10 + (uint)bVar3 + 10;
    }
    in = in + 1;
  } while( true );
}

Assistant:

inline
unsigned int strtoul16( const char* in, const char** out=0) {
    unsigned int value( 0 );
    for ( ;; ) {
        if ( *in >= '0' && *in <= '9' ) {
            value = ( value << 4u ) + ( *in - '0' );
        } else if (*in >= 'A' && *in <= 'F') {
            value = ( value << 4u ) + ( *in - 'A' ) + 10;
        } else if (*in >= 'a' && *in <= 'f') {
            value = ( value << 4u ) + ( *in - 'a' ) + 10;
        } else {
            break;
        }
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}